

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_connection_state(Curl_easy *data,_Bool *done)

{
  smb_conn_state sVar1;
  connectdata *conn;
  CURLcode CVar2;
  _Bool ssl_done;
  void *msg;
  _Bool local_29;
  void *local_28;
  
  conn = data->conn;
  local_28 = (void *)0x0;
  if ((conn->proto).smbc.state == SMB_CONNECTING) {
    if ((conn->handler->flags & 1) != 0) {
      local_29 = false;
      CVar2 = Curl_conn_connect(data,0,false,&local_29);
      if ((CVar2 != CURLE_OK) && (CVar2 != CURLE_AGAIN)) {
        return CVar2;
      }
      if (local_29 != true) {
        return CURLE_OK;
      }
    }
    CVar2 = smb_send_message(data,'r',"",0xf);
    if (CVar2 != CURLE_OK) goto LAB_00153098;
    (data->conn->proto).smbc.state = SMB_NEGOTIATE;
  }
  CVar2 = smb_send_and_recv(data,&local_28);
  if ((CVar2 == CURLE_OK) || (CVar2 == CURLE_AGAIN)) {
    if (local_28 == (void *)0x0) {
      return CURLE_OK;
    }
    sVar1 = (conn->proto).smbc.state;
    if (sVar1 == SMB_SETUP) {
      if (*(int *)((long)local_28 + 9) != 0) {
        Curl_conncontrol(conn,1);
        return CURLE_LOGIN_DENIED;
      }
      (conn->proto).smbc.uid = *(unsigned_short *)((long)local_28 + 0x20);
      (data->conn->proto).smbc.state = SMB_CONNECTED;
      *done = true;
    }
    else if (sVar1 == SMB_NEGOTIATE) {
      if (((conn->proto).ftpc.pp.sendbuf.toobig < 0x51) || (*(int *)((long)local_28 + 9) != 0)) {
        Curl_conncontrol(conn,1);
        return CURLE_COULDNT_CONNECT;
      }
      (conn->proto).ftpc.pp.sendsize = *(size_t *)((long)local_28 + 0x49);
      (conn->proto).smbc.session_key = *(uint *)((long)local_28 + 0x34);
      CVar2 = smb_send_setup(data);
      if (CVar2 != CURLE_OK) {
        Curl_conncontrol(conn,1);
        return CVar2;
      }
      (data->conn->proto).smbc.state = SMB_SETUP;
    }
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    return CURLE_OK;
  }
LAB_00153098:
  Curl_conncontrol(conn,1);
  return CVar2;
}

Assistant:

static CURLcode smb_connection_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_negotiate_response *nrsp;
  struct smb_header *h;
  CURLcode result;
  void *msg = NULL;

  if(smbc->state == SMB_CONNECTING) {
#ifdef USE_SSL
    if((conn->handler->flags & PROTOPT_SSL)) {
      bool ssl_done = FALSE;
      result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssl_done);
      if(result && result != CURLE_AGAIN)
        return result;
      if(!ssl_done)
        return CURLE_OK;
    }
#endif

    result = smb_send_negotiate(data);
    if(result) {
      connclose(conn, "SMB: failed to send negotiate message");
      return result;
    }

    conn_state(data, SMB_NEGOTIATE);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(smbc->state) {
  case SMB_NEGOTIATE:
    if((smbc->got < sizeof(*nrsp) + sizeof(smbc->challenge) - 1) ||
       h->status) {
      connclose(conn, "SMB: negotiation failed");
      return CURLE_COULDNT_CONNECT;
    }
    nrsp = msg;
    memcpy(smbc->challenge, nrsp->bytes, sizeof(smbc->challenge));
    smbc->session_key = smb_swap32(nrsp->session_key);
    result = smb_send_setup(data);
    if(result) {
      connclose(conn, "SMB: failed to send setup message");
      return result;
    }
    conn_state(data, SMB_SETUP);
    break;

  case SMB_SETUP:
    if(h->status) {
      connclose(conn, "SMB: authentication failed");
      return CURLE_LOGIN_DENIED;
    }
    smbc->uid = smb_swap16(h->uid);
    conn_state(data, SMB_CONNECTED);
    *done = true;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  return CURLE_OK;
}